

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::DuplicateNameDetector::check
          (DuplicateNameDetector *this,Reader nestedDecls,Which parentKind)

{
  ushort uVar1;
  Reader nestedDecls_00;
  Reader nestedDecls_01;
  Reader exp;
  ListElementCount LVar2;
  Which parentKind_00;
  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_> _Var3;
  void *pvVar4;
  _func_int **pp_Var5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [8];
  char *pcVar9;
  ulong uVar10;
  char (*extraout_RDX) [25];
  char (*extraout_RDX_00) [25];
  char (*params) [25];
  WirePointer WVar11;
  WirePointer WVar12;
  ulong uVar13;
  ErrorReporter *pEVar14;
  char (*in_R8) [36];
  char (*pacVar15) [36];
  char (*pacVar16) [36];
  WirePointer WVar17;
  ElementCount index;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_bool>
  pVar21;
  StringPtr SVar22;
  Reader RVar23;
  Reader nameText;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Reader name;
  Reader decl;
  Fault f;
  ArrayPtr<const_char> local_198;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  WirePointer local_178;
  WirePointer *pWStack_170;
  undefined8 local_168;
  WirePointer *pWStack_160;
  undefined8 local_158;
  WireValue<uint32_t>_conflict local_148;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  WirePointer local_138;
  WireValue<uint32_t>_conflict WStack_130;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_12c;
  uint local_128;
  StructPointerCount SStack_124;
  undefined2 uStack_122;
  int iStack_120;
  uint local_118;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_114;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  void *in_stack_fffffffffffffef8;
  WirePointer in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  ushort in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff0e;
  uint in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14 [12];
  Fault local_d0;
  uint local_c4;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  LVar2 = nestedDecls.reader.elementCount;
  if (nestedDecls.reader.elementCount != 0) {
    index = 0;
    do {
      WVar11.offsetAndKind.value = 0;
      WVar11.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      capnp::_::ListReader::getStructElement((StructReader *)&local_118,&nestedDecls.reader,index);
      uVar6 = in_stack_ffffffffffffff10;
      local_178 = in_stack_ffffffffffffff00;
      if (in_stack_ffffffffffffff0c == 0) {
        uVar6 = 0x7fffffff;
        local_178 = WVar11;
      }
      local_188._0_4_ = 0;
      local_188._4_4_ = 0;
      uVar19 = 0;
      uVar20 = 0;
      if (in_stack_ffffffffffffff0c != 0) {
        local_188._0_4_ = local_118;
        local_188._4_4_ = aStack_114;
        uVar19 = in_stack_fffffffffffffef0;
        uVar20 = in_stack_fffffffffffffef4;
      }
      uStack_180 = (char (*) [36])CONCAT44(uVar20,uVar19);
      pWStack_170._0_4_ = uVar6;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_148,(PointerReader *)local_188,(word *)0x0);
      local_178.offsetAndKind.value = 0;
      local_178.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      iVar7 = 0x7fffffff;
      if (SStack_124 != 0) {
        local_178.field_1.upper32Bits = aStack_12c.upper32Bits;
        local_178.offsetAndKind.value = WStack_130.value;
        iVar7 = iStack_120;
      }
      local_188._0_4_ = 0;
      local_188._4_4_ = 0;
      uVar19 = 0;
      uVar20 = 0;
      if (SStack_124 != 0) {
        local_188._0_4_ = local_148;
        local_188._4_4_ = aStack_144;
        uVar19 = uStack_140;
        uVar20 = uStack_13c;
      }
      uStack_180 = (char (*) [36])CONCAT44(uVar20,uVar19);
      pWStack_170 = (WirePointer *)CONCAT44(pWStack_170._4_4_,iVar7);
      local_198 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)local_188,(void *)0x0,0);
      local_188 = (undefined1  [8])local_198.ptr;
      uStack_180 = (char (*) [36])local_198.size_;
      local_178.field_1.upper32Bits = aStack_144.upper32Bits;
      local_178.offsetAndKind.value = local_148.value;
      pWStack_170 = (WirePointer *)CONCAT44(uStack_13c,uStack_140);
      pWStack_160 = (WirePointer *)CONCAT44(aStack_12c.upper32Bits,WStack_130.value);
      local_158._4_2_ = SStack_124;
      local_158._0_4_ = local_128;
      local_158._6_2_ = uStack_122;
      local_168 = (WirePointer *)local_138;
      pVar21 = std::
               _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
               ::
               _M_emplace_unique<std::pair<capnp::Text::Reader,capnp::compiler::LocatedText::Reader>>
                         ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
                           *)&this->names,
                          (pair<capnp::Text::Reader,_capnp::compiler::LocatedText::Reader> *)
                          local_188);
      _Var3 = pVar21.first._M_node;
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (((local_198.size_ == 1) && (0x1f < in_stack_ffffffffffffff08)) &&
           (*(short *)((long)in_stack_fffffffffffffef8 + 2) == 7)) {
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[51]>
                    ((String *)local_188,(kj *)"An unnamed union is already defined in this scope.",
                     pVar21._8_8_);
          auVar8 = (undefined1  [8])(ErrorReporter *)0x524569;
          if (uStack_180 != (char (*) [36])0x0) {
            auVar8 = local_188;
          }
          uVar10 = 0;
          if (local_128 < 0x20) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)((WireValue<uint32_t>_conflict *)local_138)->value;
            if (0x3f < local_128) {
              uVar10 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_138 + 4))->
                              upper32Bits;
            }
          }
          (**pEVar14->_vptr_ErrorReporter)
                    (pEVar14,uVar13,uVar10,auVar8,
                     (long)*uStack_180 + (ulong)(uStack_180 == (char (*) [36])0x0));
          pacVar15 = uStack_180;
          auVar8 = local_188;
          params = extraout_RDX;
          if (local_188 != (undefined1  [8])0x0) {
            local_188 = (undefined1  [8])0x0;
            uStack_180 = (char (*) [36])0x0;
            (*(code *)**(undefined8 **)local_178)(local_178,auVar8,1,pacVar15,pacVar15);
            params = extraout_RDX_00;
          }
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[25]>((String *)local_188,(kj *)"Previously defined here.",params);
          auVar8 = (undefined1  [8])(ErrorReporter *)0x524569;
          if (uStack_180 != (char (*) [36])0x0) {
            auVar8 = local_188;
          }
          in_R8 = (char (*) [36])(*uStack_180 + (uStack_180 == (char (*) [36])0x0));
          uVar10 = 0;
          if (*(uint *)&_Var3._M_node[2]._M_left < 0x20) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)**(uint **)(_Var3._M_node + 2);
            if (0x3f < *(uint *)&_Var3._M_node[2]._M_left) {
              uVar10 = (ulong)(*(uint **)(_Var3._M_node + 2))[1];
            }
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar10,auVar8);
          pacVar15 = uStack_180;
          auVar8 = local_188;
          if (local_188 != (undefined1  [8])0x0) {
            local_188 = (undefined1  [8])0x0;
            uStack_180 = (char (*) [36])0x0;
            (*(code *)**(undefined8 **)local_178)(local_178,auVar8,1);
            in_R8 = pacVar15;
          }
        }
        else {
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[36]>
                    ((String *)local_188,(kj *)0x57c9bf,(char (*) [2])&local_198,
                     (Reader *)"\' is already defined in this scope.",in_R8);
          auVar8 = (undefined1  [8])(ErrorReporter *)0x524569;
          if (uStack_180 != (char (*) [36])0x0) {
            auVar8 = local_188;
          }
          pacVar15 = (char (*) [36])(*uStack_180 + (uStack_180 == (char (*) [36])0x0));
          uVar10 = 0;
          if (local_128 < 0x20) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)((WireValue<uint32_t>_conflict *)local_138)->value;
            if (0x3f < local_128) {
              uVar10 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_138 + 4))->
                              upper32Bits;
            }
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar10,auVar8);
          pacVar16 = uStack_180;
          auVar8 = local_188;
          if (local_188 != (undefined1  [8])0x0) {
            local_188 = (undefined1  [8])0x0;
            uStack_180 = (char (*) [36])0x0;
            (*(code *)**(undefined8 **)local_178)(local_178,auVar8,1,pacVar16,pacVar16,0);
            pacVar15 = pacVar16;
          }
          pEVar14 = this->errorReporter;
          kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[27]>
                    ((String *)local_188,(kj *)0x57c9bf,(char (*) [2])&local_198,
                     (Reader *)"\' previously defined here.",(char (*) [27])pacVar15);
          auVar8 = (undefined1  [8])(ErrorReporter *)0x524569;
          if (uStack_180 != (char (*) [36])0x0) {
            auVar8 = local_188;
          }
          in_R8 = (char (*) [36])(*uStack_180 + (uStack_180 == (char (*) [36])0x0));
          uVar10 = 0;
          if (*(uint *)&_Var3._M_node[2]._M_left < 0x20) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)**(uint **)(_Var3._M_node + 2);
            if (0x3f < *(uint *)&_Var3._M_node[2]._M_left) {
              uVar10 = (ulong)(*(uint **)(_Var3._M_node + 2))[1];
            }
          }
          (**pEVar14->_vptr_ErrorReporter)(pEVar14,uVar13,uVar10,auVar8);
          pacVar15 = uStack_180;
          auVar8 = local_188;
          if (local_188 != (undefined1  [8])0x0) {
            local_188 = (undefined1  [8])0x0;
            uStack_180 = (char (*) [36])0x0;
            (*(code *)**(undefined8 **)local_178)(local_178,auVar8,1);
            in_R8 = pacVar15;
          }
        }
      }
      WVar12.offsetAndKind.value = 0;
      WVar12.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      if (in_stack_ffffffffffffff08 < 0x20) {
LAB_003c001e:
        local_188 = (undefined1  [8])(local_198.size_ - 1);
        uStack_180 = (char (*) [36])((ulong)uStack_180 & 0xffffffff00000000);
        local_178 = (WirePointer)0x4d6514;
        pWStack_170 = (WirePointer *)&DAT_00000005;
        local_168 = (WirePointer *)CONCAT71(local_168._1_7_,local_188 == (undefined1  [8])0x0);
        if (local_188 != (undefined1  [8])0x0) {
          local_c4 = 0;
          if (0x1f < in_stack_ffffffffffffff08) {
            local_c4 = (uint)*(ushort *)((long)in_stack_fffffffffffffef8 + 2);
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[55],unsigned_int>
                    (&local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x314,FAILED,"nameText.size() == 0",
                     "_kjCondition,\"Don\'t know what naming rules to enforce for node type.\", (uint)decl.which()"
                     ,(DebugComparison<unsigned_long,_int> *)local_188,
                     (char (*) [55])"Don\'t know what naming rules to enforce for node type.",
                     &local_c4);
          kj::_::Debug::Fault::fatal(&local_d0);
        }
      }
      else {
        uVar1 = *(ushort *)((long)in_stack_fffffffffffffef8 + 2);
        if (0xb < uVar1) goto LAB_003c001e;
        if ((0xdd4U >> (uVar1 & 0x1f) & 1) == 0) {
          if ((0x228U >> (uVar1 & 0x1f) & 1) == 0) {
            if (uVar1 != 1) goto LAB_003c001e;
            local_178 = (WirePointer)((long)in_stack_ffffffffffffff00 + 0x28);
            local_188._0_4_ = local_118;
            local_188._4_4_ = aStack_114;
            uVar19 = in_stack_fffffffffffffef0;
            uVar20 = in_stack_fffffffffffffef4;
            uVar6 = in_stack_ffffffffffffff10;
            if (in_stack_ffffffffffffff0c < 6) {
              local_188._0_4_ = 0;
              local_188._4_4_ = 0;
              uVar19 = 0;
              uVar20 = 0;
              uVar6 = 0x7fffffff;
              local_178 = WVar12;
            }
            uStack_180 = (char (*) [36])CONCAT44(uVar20,uVar19);
            pWStack_170 = (WirePointer *)CONCAT44(pWStack_170._4_4_,uVar6);
            capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)local_188,(word *)0x0);
            exp._reader.segment._4_4_ = in_stack_fffffffffffffef4;
            exp._reader.segment._0_4_ = in_stack_fffffffffffffef0;
            exp._reader.capTable = (CapTableReader *)in_stack_fffffffffffffef8;
            exp._reader.data = (void *)in_stack_ffffffffffffff00;
            exp._reader.pointers._0_4_ = in_stack_ffffffffffffff08;
            exp._reader.pointers._4_2_ = in_stack_ffffffffffffff0c;
            exp._reader.pointers._6_2_ = in_stack_ffffffffffffff0e;
            exp._reader.dataSize = in_stack_ffffffffffffff10;
            exp._reader.pointerCount = in_stack_ffffffffffffff14._0_2_;
            exp._reader._38_2_ = in_stack_ffffffffffffff14._2_2_;
            exp._reader.nestingLimit = in_stack_ffffffffffffff14._4_4_;
            exp._reader._44_4_ = in_stack_ffffffffffffff14._8_4_;
            SVar22 = getExpressionTargetName(exp);
            if ((SVar22.content.size_ != 1) && ((byte)(*SVar22.content.ptr + 0x9fU) < 0x1a))
            goto LAB_003c0073;
          }
          if ((local_198.size_ != 1) && ((byte)(*local_198.ptr + 0xa5U) < 0xe6)) {
            uVar10 = 0;
            if (local_128 < 0x20) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)((WireValue<uint32_t>_conflict *)local_138)->value;
              if (0x3f < local_128) {
                uVar10 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_138 + 4))
                                ->upper32Bits;
              }
            }
            pEVar14 = this->errorReporter;
            pp_Var5 = pEVar14->_vptr_ErrorReporter;
            in_R8 = (char (*) [36])0x2d;
            pcVar9 = "Type names must begin with a capital letter.";
            goto LAB_003c01da;
          }
        }
        else {
LAB_003c0073:
          if ((local_198.size_ != 1) && ((byte)(*local_198.ptr + 0x85U) < 0xe6)) {
            uVar10 = 0;
            if (local_128 < 0x20) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)((WireValue<uint32_t>_conflict *)local_138)->value;
              if (0x3f < local_128) {
                uVar10 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_138 + 4))
                                ->upper32Bits;
              }
            }
            pEVar14 = this->errorReporter;
            pp_Var5 = pEVar14->_vptr_ErrorReporter;
            in_R8 = (char (*) [36])0x34;
            pcVar9 = "Non-type names must begin with a lower-case letter.";
LAB_003c01da:
            (**pp_Var5)(pEVar14,uVar13,uVar10,pcVar9);
          }
        }
      }
      pvVar4 = memchr(local_198.ptr,0x5f,local_198.size_ - 1);
      if (pvVar4 != (void *)0x0) {
        uVar10 = 0;
        if (local_128 < 0x20) {
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)((WireValue<uint32_t>_conflict *)local_138)->value;
          if (0x3f < local_128) {
            uVar10 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_138 + 4))->
                            upper32Bits;
          }
        }
        in_R8 = (char (*) [36])0xab;
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar13,uVar10,
                   "Cap\'n Proto declaration names should use camelCase and must not contain underscores. (Code generators may convert names to the appropriate style for the target language.)"
                  );
      }
      if (in_stack_ffffffffffffff08 < 0x20) {
        pEVar14 = this->errorReporter;
        uVar13 = 0;
        uVar10 = 0;
LAB_003c0244:
        pp_Var5 = pEVar14->_vptr_ErrorReporter;
        in_R8 = (char (*) [36])0x2e;
        pcVar9 = "This kind of declaration doesn\'t belong here.";
LAB_003c0254:
        (**pp_Var5)(pEVar14,uVar13,uVar10,pcVar9);
      }
      else {
        switch(*(undefined2 *)((long)in_stack_fffffffffffffef8 + 2)) {
        case 1:
        case 2:
        case 3:
        case 5:
        case 9:
        case 0xb:
          if ((INTERFACE < parentKind) || ((0x221U >> (parentKind & 0x1f) & 1) == 0)) {
            uVar10 = 0;
            if (in_stack_ffffffffffffff08 < 0x40) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 4);
              if (0x5f < in_stack_ffffffffffffff08) {
                uVar10 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 8);
              }
            }
            pEVar14 = this->errorReporter;
            goto LAB_003c0244;
          }
          break;
        case 4:
          if (parentKind == ENUM) break;
          uVar10 = 0;
          if (in_stack_ffffffffffffff08 < 0x40) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 4);
            if (0x5f < in_stack_ffffffffffffff08) {
              uVar10 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 8);
            }
          }
          pEVar14 = this->errorReporter;
          pp_Var5 = pEVar14->_vptr_ErrorReporter;
          in_R8 = (char (*) [36])0x25;
          pcVar9 = "Enumerants can only appear in enums.";
          goto LAB_003c0254;
        case 6:
        case 7:
        case 8:
          if ((GROUP < parentKind) || ((0x1a0U >> (parentKind & 0x1f) & 1) == 0)) {
            uVar10 = 0;
            if (in_stack_ffffffffffffff08 < 0x40) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 4);
              if (0x5f < in_stack_ffffffffffffff08) {
                uVar10 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 8);
              }
            }
            in_R8 = (char (*) [36])0x2d;
            (**this->errorReporter->_vptr_ErrorReporter)
                      (this->errorReporter,uVar13,uVar10,
                       "This declaration can only appear in structs.");
          }
          bVar18 = in_stack_ffffffffffffff0c == 0;
          local_138 = in_stack_ffffffffffffff00;
          if (bVar18) {
            local_138 = WVar12;
          }
          WStack_130.value = in_stack_ffffffffffffff10;
          if (bVar18) {
            WStack_130.value = 0x7fffffff;
          }
          local_148.value = 0;
          aStack_144.upper32Bits = 0;
          uStack_140 = 0;
          uStack_13c = 0;
          if (!bVar18) {
            local_148.value = local_118;
            aStack_144 = aStack_114;
            uStack_140 = in_stack_fffffffffffffef0;
            uStack_13c = in_stack_fffffffffffffef4;
          }
          capnp::_::PointerReader::getStruct
                    ((StructReader *)local_188,(PointerReader *)&local_148,(word *)0x0);
          local_138 = (WirePointer)(WirePointer *)0x0;
          WStack_130.value = 0x7fffffff;
          if (local_168._4_2_ != 0) {
            local_138 = (WirePointer)pWStack_170;
            WStack_130.value = (uint)pWStack_160;
          }
          local_148.value = 0;
          aStack_144.upper32Bits = 0;
          uStack_140 = 0;
          uStack_13c = 0;
          if (local_168._4_2_ != 0) {
            local_148.value = local_188._0_4_;
            aStack_144 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_188._4_4_;
            uStack_140 = (undefined4)uStack_180;
            uStack_13c = uStack_180._4_4_;
          }
          RVar23 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_148,(void *)0x0,0);
          if (RVar23.super_StringPtr.content.size_ == 1) {
            local_178 = (WirePointer)((long)in_stack_ffffffffffffff00 + 0x10);
            WVar17.offsetAndKind.value = 0;
            WVar17.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            local_188._0_4_ = local_118;
            local_188._4_4_ = aStack_114;
            uVar19 = in_stack_fffffffffffffef0;
            uVar20 = in_stack_fffffffffffffef4;
            uVar6 = in_stack_ffffffffffffff10;
            if (in_stack_ffffffffffffff0c < 3) {
              local_188._0_4_ = 0;
              local_188._4_4_ = 0;
              uVar19 = 0;
              uVar20 = 0;
              uVar6 = 0x7fffffff;
              local_178 = WVar17;
            }
            uStack_180 = (char (*) [36])CONCAT44(uVar20,uVar19);
            pWStack_170 = (WirePointer *)CONCAT44(pWStack_170._4_4_,uVar6);
            capnp::_::PointerReader::getList
                      (&local_90,(PointerReader *)local_188,INLINE_COMPOSITE,(word *)0x0);
            if (0x1f < in_stack_ffffffffffffff08) {
              WVar17._2_6_ = 0;
              WVar17.offsetAndKind.value._0_2_ = *(ushort *)((long)in_stack_fffffffffffffef8 + 2);
            }
            nestedDecls_00.reader.capTable = local_90.capTable;
            nestedDecls_00.reader.segment = local_90.segment;
            nestedDecls_00.reader.ptr = local_90.ptr;
            nestedDecls_00.reader.elementCount = local_90.elementCount;
            nestedDecls_00.reader.step = local_90.step;
            nestedDecls_00.reader.structDataSize = local_90.structDataSize;
            nestedDecls_00.reader.structPointerCount = local_90.structPointerCount;
            nestedDecls_00.reader.elementSize = local_90.elementSize;
            nestedDecls_00.reader._39_1_ = local_90._39_1_;
            nestedDecls_00.reader.nestingLimit = local_90.nestingLimit;
            nestedDecls_00.reader._44_4_ = local_90._44_4_;
            check(this,nestedDecls_00,(Which)WVar17.offsetAndKind.value);
          }
          else {
            local_188 = (undefined1  [8])this->errorReporter;
            local_178 = (WirePointer)((ulong)local_178 & 0xffffffff00000000);
            pWStack_170 = (WirePointer *)0x0;
            local_138 = (WirePointer)((long)in_stack_ffffffffffffff00 + 0x10);
            if (in_stack_ffffffffffffff0c < 3) {
              local_138 = (WirePointer)(WirePointer *)0x0;
            }
            local_158._0_4_ = 0;
            local_158._4_2_ = 0;
            local_158._6_2_ = 0;
            local_148.value = local_118;
            aStack_144 = aStack_114;
            uStack_140 = in_stack_fffffffffffffef0;
            uStack_13c = in_stack_fffffffffffffef4;
            WStack_130.value = in_stack_ffffffffffffff10;
            if (in_stack_ffffffffffffff0c < 3) {
              local_148.value = 0;
              aStack_144.upper32Bits = 0;
              uStack_140 = 0;
              uStack_13c = 0;
              WStack_130.value = 0x7fffffff;
            }
            local_168 = &local_178;
            pWStack_160 = &local_178;
            capnp::_::PointerReader::getList
                      (&local_c0,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
            if (in_stack_ffffffffffffff08 < 0x20) {
              parentKind_00 = FILE;
            }
            else {
              parentKind_00 = *(Which *)((long)in_stack_fffffffffffffef8 + 2);
            }
            nestedDecls_01.reader.capTable = local_c0.capTable;
            nestedDecls_01.reader.segment = local_c0.segment;
            nestedDecls_01.reader.ptr = local_c0.ptr;
            nestedDecls_01.reader.elementCount = local_c0.elementCount;
            nestedDecls_01.reader.step = local_c0.step;
            nestedDecls_01.reader.structDataSize = local_c0.structDataSize;
            nestedDecls_01.reader.structPointerCount = local_c0.structPointerCount;
            nestedDecls_01.reader.elementSize = local_c0.elementSize;
            nestedDecls_01.reader._39_1_ = local_c0._39_1_;
            nestedDecls_01.reader.nestingLimit = local_c0.nestingLimit;
            nestedDecls_01.reader._44_4_ = local_c0._44_4_;
            check((DuplicateNameDetector *)local_188,nestedDecls_01,parentKind_00);
            std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
            ::~_Rb_tree((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
                         *)(local_188 + 8));
          }
          break;
        case 10:
          if (parentKind != INTERFACE) {
            uVar10 = 0;
            if (in_stack_ffffffffffffff08 < 0x40) {
              uVar13 = 0;
            }
            else {
              uVar13 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 4);
              if (0x5f < in_stack_ffffffffffffff08) {
                uVar10 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 8);
              }
            }
            pEVar14 = this->errorReporter;
            pp_Var5 = pEVar14->_vptr_ErrorReporter;
            in_R8 = (char (*) [36])0x27;
            pcVar9 = "Methods can only appear in interfaces.";
            goto LAB_003c0254;
          }
          break;
        default:
          pEVar14 = this->errorReporter;
          uVar10 = 0;
          if (in_stack_ffffffffffffff08 < 0x40) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 4);
            if (0x5f < in_stack_ffffffffffffff08) {
              uVar10 = (ulong)*(uint *)((long)in_stack_fffffffffffffef8 + 8);
            }
          }
          goto LAB_003c0244;
        }
      }
      index = index + 1;
    } while (LVar2 != index);
  }
  return;
}

Assistant:

void NodeTranslator::DuplicateNameDetector::check(
    List<Declaration>::Reader nestedDecls, Declaration::Which parentKind) {
  for (auto decl: nestedDecls) {
    {
      auto name = decl.getName();
      auto nameText = name.getValue();
      auto insertResult = names.insert(std::make_pair(nameText, name));
      if (!insertResult.second) {
        if (nameText.size() == 0 && decl.isUnion()) {
          errorReporter.addErrorOn(
              name, kj::str("An unnamed union is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("Previously defined here."));
        } else {
          errorReporter.addErrorOn(
              name, kj::str("'", nameText, "' is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("'", nameText, "' previously defined here."));
        }
      }

      switch (decl.which()) {
        case Declaration::USING: {
          kj::StringPtr targetName = getExpressionTargetName(decl.getUsing().getTarget());
          if (targetName.size() > 0 && targetName[0] >= 'a' && targetName[0] <= 'z') {
            // Target starts with lower-case letter, so alias should too.
            if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
              errorReporter.addErrorOn(name,
                  "Non-type names must begin with a lower-case letter.");
            }
          } else {
            // Target starts with capital or is not named (probably, an import). Require
            // capitalization.
            if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
              errorReporter.addErrorOn(name,
                  "Type names must begin with a capital letter.");
            }
          }
          break;
        }

        case Declaration::ENUM:
        case Declaration::STRUCT:
        case Declaration::INTERFACE:
          if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
            errorReporter.addErrorOn(name,
                "Type names must begin with a capital letter.");
          }
          break;

        case Declaration::CONST:
        case Declaration::ANNOTATION:
        case Declaration::ENUMERANT:
        case Declaration::METHOD:
        case Declaration::FIELD:
        case Declaration::UNION:
        case Declaration::GROUP:
          if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
            errorReporter.addErrorOn(name,
                "Non-type names must begin with a lower-case letter.");
          }
          break;

        default:
          KJ_ASSERT(nameText.size() == 0, "Don't know what naming rules to enforce for node type.",
                    (uint)decl.which());
          break;
      }

      if (nameText.findFirst('_') != kj::none) {
        errorReporter.addErrorOn(name,
            "Cap'n Proto declaration names should use camelCase and must not contain "
            "underscores. (Code generators may convert names to the appropriate style for the "
            "target language.)");
      }
    }

    switch (decl.which()) {
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUM:
      case Declaration::STRUCT:
      case Declaration::INTERFACE:
      case Declaration::ANNOTATION:
        switch (parentKind) {
          case Declaration::FILE:
          case Declaration::STRUCT:
          case Declaration::INTERFACE:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
            break;
        }
        break;

      case Declaration::ENUMERANT:
        if (parentKind != Declaration::ENUM) {
          errorReporter.addErrorOn(decl, "Enumerants can only appear in enums.");
        }
        break;
      case Declaration::METHOD:
        if (parentKind != Declaration::INTERFACE) {
          errorReporter.addErrorOn(decl, "Methods can only appear in interfaces.");
        }
        break;
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
        switch (parentKind) {
          case Declaration::STRUCT:
          case Declaration::UNION:
          case Declaration::GROUP:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This declaration can only appear in structs.");
            break;
        }

        // Struct members may have nested decls.  We need to check those here, because no one else
        // is going to do it.
        if (decl.getName().getValue().size() == 0) {
          // Unnamed union.  Check members as if they are in the same scope.
          check(decl.getNestedDecls(), decl.which());
        } else {
          // Children are in their own scope.
          DuplicateNameDetector(errorReporter)
              .check(decl.getNestedDecls(), decl.which());
        }

        break;

      default:
        errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
        break;
    }
  }
}